

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_collection.hpp
# Opt level: O1

unsigned_long __thiscall
duckdb::WindowCursor::GetCell<unsigned_long>(WindowCursor *this,idx_t col_idx,idx_t row_idx)

{
  idx_t iVar1;
  pointer this_00;
  reference pvVar2;
  
  if (((this->state).next_row_index <= row_idx) || (row_idx < (this->state).current_row_index)) {
    this_00 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
              ::operator->(&this->paged->inputs);
    ColumnDataCollection::Seek(this_00,row_idx,&this->state,&this->chunk);
  }
  iVar1 = (this->state).current_row_index;
  pvVar2 = vector<duckdb::Vector,_true>::operator[](&(this->chunk).data,col_idx);
  return *(unsigned_long *)(pvVar2->data + (ulong)(uint)((int)row_idx - (int)iVar1) * 8);
}

Assistant:

T GetCell(idx_t col_idx, idx_t row_idx) {
		D_ASSERT(chunk.ColumnCount() > col_idx);
		auto index = Seek(row_idx);
		auto &source = chunk.data[col_idx];
		const auto data = FlatVector::GetData<T>(source);
		return data[index];
	}